

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deffunc.cpp
# Opt level: O0

ObjectPtr __thiscall ICM::DefFunc::BoolCalc::Not::func(Not *this,DataList *list)

{
  Object *obj;
  Object **ppOVar1;
  Ty<6UL> *pTVar2;
  lightlist<ICM::Object_*> *in_RDX;
  T local_21;
  lightlist<ICM::Object_*> *local_20;
  DataList *list_local;
  Not *this_local;
  
  local_20 = in_RDX;
  list_local = list;
  this_local = this;
  obj = (Object *)operator_new(0x10);
  ppOVar1 = Common::lightlist<ICM::Object_*>::operator[](local_20,0);
  pTVar2 = Object::dat<6ul>(*ppOVar1);
  local_21 = (T)(~*pTVar2 & 1);
  Objects::DataObject<(ICM::DefaultType)6>::DataObject
            ((DataObject<(ICM::DefaultType)6> *)obj,&local_21);
  ObjectPtr::ObjectPtr((ObjectPtr *)this,obj);
  return (ObjectPtr)(Object *)this;
}

Assistant:

ObjectPtr func(const DataList &list) const {
					return ObjectPtr(new Boolean(!list[0]->dat<T_Boolean>()));
				}